

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTiming.c
# Opt level: O2

int SimpleTimingDoRender(void)

{
  char cVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [12];
  unkbyte10 Var4;
  undefined1 auVar5 [12];
  float *pfVar6;
  char cVar7;
  int iVar8;
  uint *puVar9;
  void *__ptr;
  IceTInt *process_ranks;
  IceTUByte *color_buffer;
  void *__ptr_00;
  long lVar10;
  uint uVar11;
  char *pcVar12;
  char cVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  char *pcVar19;
  char *pcVar20;
  double *sendbuf;
  IceTDouble *pIVar21;
  IceTSizeType idx;
  IceTInt IVar22;
  int iVar23;
  long lVar24;
  uint *puVar25;
  char cVar26;
  float fVar27;
  double dVar28;
  IceTDouble IVar29;
  undefined1 auVar30 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  IceTInt rank;
  IceTInt num_proc;
  char *local_390;
  uint *local_388;
  double local_380;
  float local_378 [4];
  float local_368 [4];
  double local_358;
  double local_350;
  uint *local_348;
  IceTImage local_340;
  void *local_338;
  double local_330;
  double local_328;
  double local_320;
  uint auStack_314 [3];
  IceTFloat background_color [4];
  IceTDouble local_2f8 [7];
  double local_2c0;
  IceTInt my_position;
  IceTDouble projection_matrix [16];
  IceTDouble modelview_matrix [16];
  IceTDouble inverse_transpose_transform [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined2 uVar33;
  
  iVar15 = SCREEN_WIDTH * g_num_tiles_x;
  local_388 = (uint *)CONCAT44(local_388._4_4_,(float)(SCREEN_HEIGHT * g_num_tiles_y));
  pIVar21 = g_opacity_lookup;
  lVar24 = 0;
  while( true ) {
    if (lVar24 == 0x1001) break;
    dVar28 = pow(2.718281828459045,(double)(int)lVar24 * -0.0009765625);
    *pIVar21 = (IceTDouble)(1.0 - dVar28);
    lVar24 = lVar24 + 1;
    pIVar21 = pIVar21 + 1;
  }
  icetGetIntegerv(2,&rank);
  icetGetIntegerv(3,&num_proc);
  if (g_colored_background == '\0') {
    background_color[0] = 0.0;
    background_color[1] = 0.0;
    background_color[2] = 0.0;
    background_color[3] = 0.0;
  }
  else {
    background_color[0] = 0.2;
    background_color[1] = 0.5;
    background_color[2] = 0.7;
    background_color[3] = 1.0;
  }
  icetDrawCallback(draw);
  if (g_transparent == '\x01') {
    icetCompositeMode(0x302);
    icetSetColorFormat(0xc002);
    icetSetDepthFormat(0xd000);
    icetEnable(0x143);
  }
  else {
    icetCompositeMode(0x301);
    icetSetColorFormat(0xc001);
    icetSetDepthFormat(0xd001);
  }
  if (g_no_interlace == '\x01') {
    icetDisable(0x145);
  }
  else {
    icetEnable(0x145);
  }
  local_380 = (double)CONCAT44(local_380._4_4_,(float)iVar15);
  if (g_no_collect == '\x01') {
    icetDisable(0x146);
  }
  else {
    icetEnable(0x146);
  }
  local_380 = (double)CONCAT44(local_380._4_4_,local_380._0_4_ / local_388._0_4_);
  icetBoundingBoxd(-0.5,0.5,-0.5,0.5,-0.5,0.5);
  local_350 = (double)CONCAT44(local_350._4_4_,rank);
  local_368[2] = -0.5;
  local_368[0] = -0.5;
  local_368[1] = -0.5;
  local_378[2] = 0.5;
  local_378[0] = 0.5;
  local_378[1] = 0.5;
  puVar25 = (uint *)0x0;
  puVar9 = (uint *)0x0;
  local_358 = (double)CONCAT44(local_358._4_4_,num_proc);
  iVar15 = 0;
  uVar17 = 0;
  IVar22 = num_proc;
  while (local_348 = puVar25, 1 < IVar22 - iVar15) {
    local_390 = (char *)CONCAT44(local_390._4_4_,local_368[uVar17]);
    local_340.opaque_internals._0_4_ = local_378[uVar17] - local_368[uVar17];
    iVar8 = (iVar15 + IVar22) / 2;
    local_388 = puVar9;
    puVar9 = (uint *)malloc(0x18);
    uVar11 = iVar8 - iVar15;
    fVar27 = ((float)(int)uVar11 * local_340.opaque_internals._0_4_) / (float)(IVar22 - iVar15) +
             local_390._0_4_;
    *puVar9 = uVar17;
    puVar9[1] = (uint)fVar27;
    puVar9[4] = 0;
    puVar9[5] = 0;
    if (local_350._0_4_ < iVar8) {
      pfVar6 = local_378;
      uVar11 = IVar22 - iVar8;
      uVar18 = 0xffffffff;
      IVar22 = iVar8;
    }
    else {
      pfVar6 = local_368;
      uVar18 = 1;
      iVar15 = iVar8;
    }
    pfVar6[uVar17] = fVar27;
    puVar9[2] = uVar18;
    puVar9[3] = uVar11;
    puVar25 = puVar9;
    if (local_388 != (uint *)0x0) {
      *(uint **)(local_388 + 4) = puVar9;
      puVar25 = local_348;
    }
    uVar17 = uVar17 + 1;
    if (uVar17 == 3) {
      uVar17 = 0;
    }
  }
  if (local_358._0_4_ < g_num_tiles_y * g_num_tiles_x) {
    printf("Not enough processes to %dx%d tiles.\n");
    iVar15 = -3;
  }
  else {
    icetResetTiles();
    iVar15 = 0;
    for (iVar8 = 0; iVar8 < g_num_tiles_y; iVar8 = iVar8 + 1) {
      for (iVar23 = 0; iVar23 < g_num_tiles_x; iVar23 = iVar23 + 1) {
        icetAddTile(SCREEN_WIDTH * iVar23,SCREEN_HEIGHT * iVar8,SCREEN_WIDTH,SCREEN_HEIGHT,
                    iVar15 + iVar23);
      }
      iVar15 = iVar15 + iVar23;
    }
    icetStrategy(g_strategy);
    icetSingleImageStrategy(g_single_image_strategy);
    icetMatrixFrustum((IceTDouble)((double)local_380._0_4_ * -0.65),
                      (IceTDouble)((double)local_380._0_4_ * 0.65),-0.65,0.65,3.0,5.0,
                      projection_matrix);
    iVar15 = (int)((long)rank % 10);
    if (iVar15 < 7) {
      cVar13 = (char)((long)rank % 10) + '\x01';
      cVar7 = cVar13 / '\x02';
      auVar34 = ZEXT216((ushort)(CONCAT11(cVar7,cVar13) >> 7)) & _DAT_00119830;
      auVar35[0] = auVar34[0] + cVar13;
      auVar35[1] = auVar34[1] + cVar7;
      auVar35._2_6_ = 0;
      auVar35[8] = auVar34[8];
      auVar35[9] = auVar34[9];
      auVar35[10] = auVar34[10];
      auVar35[0xb] = auVar34[0xb];
      auVar35[0xc] = auVar34[0xc];
      auVar35[0xd] = auVar34[0xd];
      auVar35[0xe] = auVar34[0xe];
      auVar35[0xf] = auVar34[0xf];
      auVar35 = auVar35 & _DAT_00119840;
      cVar26 = cVar13 - auVar35[0];
      cVar7 = cVar7 - auVar35[1];
      cVar1 = -auVar35[7];
      Var4 = CONCAT91(CONCAT81((long)(CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11
                                                  (cVar1,cVar1),-auVar35[6]),-auVar35[6]),
                                                  -auVar35[5]),-auVar35[5]),-auVar35[4]),
                                               CONCAT11(-auVar35[4],cVar1)) >> 8),-auVar35[3]),
                      -auVar35[3]);
      auVar3._2_10_ = Var4;
      auVar3[1] = -auVar35[2];
      auVar3[0] = -auVar35[2];
      auVar2._2_12_ = auVar3;
      auVar2[1] = cVar7;
      auVar2[0] = cVar7;
      auVar34._0_2_ = CONCAT11(cVar26,cVar26);
      auVar34._2_14_ = auVar2;
      uVar33 = (undefined2)Var4;
      auVar32._0_12_ = auVar34._0_12_;
      auVar32._12_2_ = uVar33;
      auVar32._14_2_ = uVar33;
      auVar31._12_4_ = auVar32._12_4_;
      auVar31._0_10_ = auVar34._0_10_;
      auVar31._10_2_ = auVar3._0_2_;
      auVar30._10_6_ = auVar31._10_6_;
      auVar30._0_8_ = auVar34._0_8_;
      auVar30._8_2_ = auVar3._0_2_;
      auVar5._4_8_ = auVar30._8_8_;
      auVar5._2_2_ = auVar2._0_2_;
      auVar5._0_2_ = auVar2._0_2_;
      g_color[0] = (float)((int)auVar34._0_2_ >> 8);
      g_color[1] = (float)(auVar5._0_4_ >> 0x18);
      g_color[2] = (float)(int)(char)((cVar13 / '\x04') % '\x02');
    }
    else {
      g_color[2] = 0.5;
      g_color[0] = 0.5;
      g_color[1] = 0.5;
      g_color[iVar15 - 7] = 0.0;
    }
    g_color[3] = 1.0;
    if (rank == 0) {
      printf("Seed = %d\n",(ulong)(uint)g_seed);
      for (iVar15 = 1; iVar15 < num_proc; iVar15 = iVar15 + 1) {
        icetCommSend(&g_seed,1,0x8003,iVar15,0x21);
      }
    }
    else {
      icetCommRecv(&g_seed,1,0x8003,0,0x21);
    }
    srand(g_seed);
    uVar16 = (ulong)g_num_frames;
    __ptr = malloc(uVar16 * 0x50);
    local_350 = (double)local_368[0];
    local_380 = (double)local_368[1];
    local_358 = (double)local_368[2];
    local_320 = (double)(local_378[0] - local_368[0]);
    local_328 = (double)(local_378[1] - local_368[1]);
    local_330 = (double)(local_378[2] - local_368[2]);
    local_338 = __ptr;
    for (puVar25 = (uint *)0x0; (long)puVar25 < (long)(int)uVar16;
        puVar25 = (uint *)((long)puVar25 + 1)) {
      local_388 = puVar25;
      icetCommBarrier();
      local_390 = (char *)icetWallTime();
      icetMatrixIdentity(modelview_matrix);
      icetMatrixMultiplyTranslate(modelview_matrix,0.0,0.0,-4.0);
      iVar15 = rand();
      icetMatrixMultiplyRotate
                (modelview_matrix,(IceTDouble)(((double)iVar15 * 360.0) / 2147483647.0),1.0,0.0,0.0)
      ;
      iVar15 = rand();
      icetMatrixMultiplyRotate
                (modelview_matrix,(IceTDouble)(((double)iVar15 * 360.0) / 2147483647.0),0.0,1.0,0.0)
      ;
      iVar15 = rand();
      icetMatrixMultiplyRotate
                (modelview_matrix,(IceTDouble)(((double)iVar15 * 360.0) / 2147483647.0),0.0,0.0,1.0)
      ;
      if (g_transparent == '\x01') {
        iVar15 = icetCommSize();
        icetMatrixMultiply((IceTDouble *)&my_position,projection_matrix,modelview_matrix);
        icetMatrixInverseTranspose((IceTDouble *)&my_position,inverse_transpose_transform);
        for (lVar24 = 0; __ptr = local_338, lVar24 != 3; lVar24 = lVar24 + 1) {
          local_2f8[0] = 0.0;
          local_2f8[1] = 0.0;
          local_2f8[2] = 0.0;
          local_2f8[3] = 0.0;
          local_2f8[lVar24] = 1.0;
          icetMatrixVectorMultiply(local_2f8 + 4,inverse_transpose_transform,local_2f8);
          auStack_314[lVar24] = (uint)(local_2c0 < 0.0) * 2 - 1;
        }
        my_position = 0;
        iVar8 = 0;
        for (puVar25 = local_348; puVar25 != (uint *)0x0; puVar25 = *(uint **)(puVar25 + 4)) {
          if (((int)(puVar25[2] & auStack_314[(int)*puVar25]) < 0) ||
             (0 < (int)auStack_314[(int)*puVar25] && 0 < (int)puVar25[2])) {
            iVar8 = iVar8 + puVar25[3];
            my_position = iVar8;
          }
        }
        process_ranks = (IceTInt *)malloc((long)iVar15 << 2);
        icetCommAllgather(&my_position,1,0x8003,process_ranks);
        icetEnable(0x142);
        icetCompositeOrder(process_ranks);
        free(process_ranks);
      }
      icetMatrixMultiplyTranslate
                (modelview_matrix,(IceTDouble)local_350,(IceTDouble)local_380,(IceTDouble)local_358)
      ;
      icetMatrixMultiplyScale
                (modelview_matrix,(IceTDouble)local_320,(IceTDouble)local_328,(IceTDouble)local_330)
      ;
      icetMatrixMultiplyTranslate(modelview_matrix,0.5,0.5,0.5);
      g_first_render = 1;
      local_340 = icetDrawFrame(projection_matrix,modelview_matrix,background_color);
      icetCommBarrier();
      IVar29 = icetWallTime();
      puVar25 = local_388;
      local_390 = (char *)((double)IVar29 - (double)local_390);
      lVar24 = (long)local_388 * 0x50;
      icetGetDoublev(0xc1,(IceTDouble *)((long)__ptr + lVar24));
      icetGetDoublev(0xc2,(IceTDouble *)((long)__ptr + lVar24 + 8));
      icetGetDoublev(0xc3,(IceTDouble *)((long)__ptr + lVar24 + 0x10));
      icetGetDoublev(0xc4,(IceTDouble *)((long)__ptr + lVar24 + 0x18));
      icetGetDoublev(0xc5,(IceTDouble *)((long)__ptr + lVar24 + 0x20));
      icetGetDoublev(200,(IceTDouble *)((long)__ptr + lVar24 + 0x28));
      icetGetDoublev(0xc6,(IceTDouble *)((long)__ptr + lVar24 + 0x30));
      icetGetDoublev(199,(IceTDouble *)((long)__ptr + lVar24 + 0x38));
      icetGetIntegerv(0xc9,(IceTInt *)((long)__ptr + lVar24 + 0x40));
      *(char **)((long)__ptr + lVar24 + 0x48) = local_390;
      if (((g_write_image == '\x01') && (puVar25 == (uint *)0x0)) &&
         (rank < g_num_tiles_y * g_num_tiles_x)) {
        color_buffer = (IceTUByte *)malloc((long)(SCREEN_WIDTH * SCREEN_HEIGHT * 4));
        icetImageCopyColorub(local_340,color_buffer,0xc001);
        sprintf((char *)&my_position,"SimpleTiming%02d.ppm",(ulong)(uint)rank);
        __ptr = local_338;
        write_ppm((char *)&my_position,color_buffer,SCREEN_WIDTH,SCREEN_HEIGHT);
        free(color_buffer);
        puVar25 = local_388;
      }
      uVar16 = (ulong)(uint)g_num_frames;
    }
    __ptr_00 = malloc((long)num_proc * 0x50);
    local_388 = (uint *)icetGetStrategyName();
    if (g_single_image_strategy == 0x7004) {
      icetGetIntegerv(0x40,&my_position);
      local_390 = SimpleTimingDoRender::name_buffer;
      sprintf(SimpleTimingDoRender::name_buffer,"radix-k %d",(ulong)(uint)my_position);
    }
    else {
      local_390 = icetGetSingleImageStrategyName();
    }
    icetGetIntegerv(0x41,&my_position);
    for (lVar24 = 0; lVar24 < g_num_frames; lVar24 = lVar24 + 1) {
      sendbuf = (double *)(lVar24 * 0x50 + (long)__ptr);
      icetCommGather(sendbuf,0x50,0x8001,__ptr_00,0);
      if (rank == 0) {
        uVar16 = 0;
        if (0 < num_proc) {
          uVar16 = (ulong)(uint)num_proc;
        }
        lVar10 = 0;
        for (lVar14 = 0; uVar16 * 0x50 - lVar14 != 0; lVar14 = lVar14 + 0x50) {
          dVar28 = *(double *)((long)__ptr_00 + lVar14);
          if (*sendbuf <= dVar28 && dVar28 != *sendbuf) {
            *sendbuf = dVar28;
          }
          dVar28 = *(double *)((long)__ptr_00 + lVar14 + 8);
          if (sendbuf[1] <= dVar28 && dVar28 != sendbuf[1]) {
            sendbuf[1] = dVar28;
          }
          dVar28 = *(double *)((long)__ptr_00 + lVar14 + 0x10);
          if (sendbuf[2] <= dVar28 && dVar28 != sendbuf[2]) {
            sendbuf[2] = dVar28;
          }
          dVar28 = *(double *)((long)__ptr_00 + lVar14 + 0x18);
          if (sendbuf[3] <= dVar28 && dVar28 != sendbuf[3]) {
            sendbuf[3] = dVar28;
          }
          dVar28 = *(double *)((long)__ptr_00 + lVar14 + 0x20);
          if (sendbuf[4] <= dVar28 && dVar28 != sendbuf[4]) {
            sendbuf[4] = dVar28;
          }
          dVar28 = *(double *)((long)__ptr_00 + lVar14 + 0x28);
          if (sendbuf[5] <= dVar28 && dVar28 != sendbuf[5]) {
            sendbuf[5] = dVar28;
          }
          dVar28 = *(double *)((long)__ptr_00 + lVar14 + 0x30);
          if (sendbuf[6] <= dVar28 && dVar28 != sendbuf[6]) {
            sendbuf[6] = dVar28;
          }
          dVar28 = *(double *)((long)__ptr_00 + lVar14 + 0x38);
          if (sendbuf[7] <= dVar28 && dVar28 != sendbuf[7]) {
            sendbuf[7] = dVar28;
          }
          iVar15 = *(int *)((long)__ptr_00 + lVar14 + 0x40);
          if (*(int *)(sendbuf + 8) < iVar15) {
            *(int *)(sendbuf + 8) = iVar15;
          }
          dVar28 = *(double *)((long)__ptr_00 + lVar14 + 0x48);
          if (sendbuf[9] <= dVar28 && dVar28 != sendbuf[9]) {
            sendbuf[9] = dVar28;
          }
          lVar10 = lVar10 + iVar15;
        }
        pcVar12 = "no";
        if (g_transparent != '\0') {
          pcVar12 = "yes";
        }
        pcVar19 = "yes";
        if (g_no_interlace != '\0') {
          pcVar19 = "no";
        }
        pcVar20 = "yes";
        if (g_no_collect != '\0') {
          pcVar20 = "no";
        }
        printf("LOG,%d,%s,%s,%d,%d,%d,%d,%s,%s,%s,%d,%d,%lg,%lg,%lg,%lg,%lg,%lg,%lg,%lg,%ld,%lg\n",
               *sendbuf,sendbuf[1],sendbuf[2],sendbuf[3],sendbuf[4],sendbuf[5],sendbuf[6],sendbuf[7]
               ,(ulong)(uint)num_proc,local_388,local_390,(ulong)(uint)g_num_tiles_x,
               (ulong)(uint)g_num_tiles_y,SCREEN_WIDTH,SCREEN_HEIGHT,pcVar12,pcVar19,pcVar20,
               my_position,(int)lVar24,lVar10,sendbuf[9]);
      }
    }
    free(__ptr_00);
    puVar25 = local_348;
    while (puVar25 != (uint *)0x0) {
      puVar9 = *(uint **)(puVar25 + 4);
      free(puVar25);
      puVar25 = puVar9;
    }
    free(__ptr);
    iVar15 = 0;
    icetCommBarrier();
  }
  return iVar15;
}

Assistant:

static int SimpleTimingDoRender()
{
    IceTInt rank;
    IceTInt num_proc;

    float aspect = (  (float)(g_num_tiles_x*SCREEN_WIDTH)
                    / (float)(g_num_tiles_y*SCREEN_HEIGHT) );
    int frame;
    float bounds_min[3];
    float bounds_max[3];
    region_divide region_divisions;

    IceTDouble projection_matrix[16];
    IceTFloat background_color[4];

    timings_type *timing_array;

    /* Normally, the first thing that you do is set up your communication and
     * then create at least one IceT context.  This has already been done in the
     * calling function (i.e. icetTests_mpi.c).  See the init_mpi_comm in
     * mpi_comm.h for an example.
     */

    init_opacity_lookup();

    /* If we had set up the communication layer ourselves, we could have gotten
     * these parameters directly from it.  Since we did not, this provides an
     * alternate way. */
    icetGetIntegerv(ICET_RANK, &rank);
    icetGetIntegerv(ICET_NUM_PROCESSES, &num_proc);

    if (g_colored_background) {
        background_color[0] = 0.2f;
        background_color[1] = 0.5f;
        background_color[2] = 0.7f;
        background_color[3] = 1.0f;
    } else {
        background_color[0] = 0.0f;
        background_color[1] = 0.0f;
        background_color[2] = 0.0f;
        background_color[3] = 0.0f;
    }

    /* Give IceT a function that will issue the drawing commands. */
    icetDrawCallback(draw);

    /* Other IceT state. */
    if (g_transparent) {
        icetCompositeMode(ICET_COMPOSITE_MODE_BLEND);
        icetSetColorFormat(ICET_IMAGE_COLOR_RGBA_FLOAT);
        icetSetDepthFormat(ICET_IMAGE_DEPTH_NONE);
        icetEnable(ICET_CORRECT_COLORED_BACKGROUND);
    } else {
        icetCompositeMode(ICET_COMPOSITE_MODE_Z_BUFFER);
        icetSetColorFormat(ICET_IMAGE_COLOR_RGBA_UBYTE);
        icetSetDepthFormat(ICET_IMAGE_DEPTH_FLOAT);
    }

    if (g_no_interlace) {
        icetDisable(ICET_INTERLACE_IMAGES);
    } else {
        icetEnable(ICET_INTERLACE_IMAGES);
    }

    if (g_no_collect) {
        icetDisable(ICET_COLLECT_IMAGES);
    } else {
        icetEnable(ICET_COLLECT_IMAGES);
    }

    /* Give IceT the bounds of the polygons that will be drawn.  Note that IceT
     * will take care of any transformation that gets passed to
     * icetDrawFrame. */
    icetBoundingBoxd(-0.5f, 0.5f, -0.5, 0.5, -0.5, 0.5);

    /* Determine the region we want the local geometry to be in.  This will be
     * used for the modelview transformation later. */
    find_region(rank, num_proc, bounds_min, bounds_max, &region_divisions);

    /* Set up the tiled display.  The asignment of displays to processes is
     * arbitrary because, as this is a timing test, I am not too concerned
     * about who shows what. */
    if (g_num_tiles_x*g_num_tiles_y <= num_proc) {
        int x, y, display_rank;
        icetResetTiles();
        display_rank = 0;
        for (y = 0; y < g_num_tiles_y; y++) {
            for (x = 0; x < g_num_tiles_x; x++) {
                icetAddTile(x*(IceTInt)SCREEN_WIDTH,
                            y*(IceTInt)SCREEN_HEIGHT,
                            SCREEN_WIDTH,
                            SCREEN_HEIGHT,
                            display_rank);
                display_rank++;
            }
        }
    } else {
        printf("Not enough processes to %dx%d tiles.\n",
               g_num_tiles_x, g_num_tiles_y);
        return TEST_FAILED;
    }

    icetStrategy(g_strategy);
    icetSingleImageStrategy(g_single_image_strategy);

    /* Set up the projection matrix. */
    icetMatrixFrustum(-0.65*aspect, 0.65*aspect, -0.65, 0.65, 3.0, 5.0,
                      projection_matrix);

    if (rank%10 < 7) {
        IceTInt color_bits = rank%10 + 1;
        g_color[0] = (float)(color_bits%2);
        g_color[1] = (float)((color_bits/2)%2);
        g_color[2] = (float)((color_bits/4)%2);
        g_color[3] = 1.0f;
    } else {
        g_color[0] = g_color[1] = g_color[2] = 0.5f;
        g_color[rank%10 - 7] = 0.0f;
        g_color[3] = 1.0f;
    }

    /* Initialize randomness. */
    if (rank == 0) {
        int i;
        printf("Seed = %d\n", g_seed);
        for (i = 1; i < num_proc; i++) {
            icetCommSend(&g_seed, 1, ICET_INT, i, 33);
        }
    } else {
        icetCommRecv(&g_seed, 1, ICET_INT, 0, 33);
    }

    srand(g_seed);

    timing_array = malloc(g_num_frames * sizeof(timings_type));

    for (frame = 0; frame < g_num_frames; frame++) {
        IceTDouble elapsed_time;
        IceTDouble modelview_matrix[16];
        IceTImage image;

        /* Get everyone to start at the same time. */
        icetCommBarrier();

        elapsed_time = icetWallTime();

        /* We can set up a modelview matrix here and IceT will factor this in
         * determining the screen projection of the geometry. */
        icetMatrixIdentity(modelview_matrix);

        /* Move geometry back so that it can be seen by the camera. */
        icetMatrixMultiplyTranslate(modelview_matrix, 0.0, 0.0, -4.0);

        /* Rotate to some random view. */
        icetMatrixMultiplyRotate(modelview_matrix,
                                 (360.0*rand())/RAND_MAX, 1.0, 0.0, 0.0);
        icetMatrixMultiplyRotate(modelview_matrix,
                                 (360.0*rand())/RAND_MAX, 0.0, 1.0, 0.0);
        icetMatrixMultiplyRotate(modelview_matrix,
                                 (360.0*rand())/RAND_MAX, 0.0, 0.0, 1.0);

        /* Determine view ordering of geometry based on camera position
           (represented by the current projection and modelview matrices). */
        if (g_transparent) {
            find_composite_order(projection_matrix,
                                 modelview_matrix,
                                 region_divisions);
        }

        /* Translate the unit box centered on the origin to the region specified
         * by bounds_min and bounds_max. */
        icetMatrixMultiplyTranslate(modelview_matrix,
                                    bounds_min[0],
                                    bounds_min[1],
                                    bounds_min[2]);
        icetMatrixMultiplyScale(modelview_matrix,
                                bounds_max[0] - bounds_min[0],
                                bounds_max[1] - bounds_min[1],
                                bounds_max[2] - bounds_min[2]);
        icetMatrixMultiplyTranslate(modelview_matrix, 0.5, 0.5, 0.5);

      /* Instead of calling draw() directly, call it indirectly through
       * icetDrawFrame().  IceT will automatically handle image
       * compositing. */
        g_first_render = ICET_TRUE;
        image = icetDrawFrame(projection_matrix,
                              modelview_matrix,
                              background_color);

        /* Let everyone catch up before finishing the frame. */
        icetCommBarrier();

        elapsed_time = icetWallTime() - elapsed_time;

        /* Print timings to logging. */
        icetGetDoublev(ICET_RENDER_TIME,
                       &timing_array[frame].render_time);
        icetGetDoublev(ICET_BUFFER_READ_TIME,
                       &timing_array[frame].buffer_read_time);
        icetGetDoublev(ICET_BUFFER_WRITE_TIME,
                       &timing_array[frame].buffer_write_time);
        icetGetDoublev(ICET_COMPRESS_TIME,
                       &timing_array[frame].compress_time);
        icetGetDoublev(ICET_BLEND_TIME,
                       &timing_array[frame].blend_time);
        icetGetDoublev(ICET_TOTAL_DRAW_TIME,
                       &timing_array[frame].draw_time);
        icetGetDoublev(ICET_COMPOSITE_TIME,
                       &timing_array[frame].composite_time);
        icetGetDoublev(ICET_COLLECT_TIME,
                       &timing_array[frame].collect_time);
        icetGetIntegerv(ICET_BYTES_SENT,
                        &timing_array[frame].bytes_sent);
        timing_array[frame].frame_time = elapsed_time;

        /* Write out image to verify rendering occurred correctly. */
        if (   g_write_image
            && (rank < (g_num_tiles_x*g_num_tiles_y))
            && (frame == 0)
               ) {
            IceTUByte *buffer = malloc(SCREEN_WIDTH*SCREEN_HEIGHT*4);
            char filename[256];
            icetImageCopyColorub(image, buffer, ICET_IMAGE_COLOR_RGBA_UBYTE);
            sprintf(filename, "SimpleTiming%02d.ppm", rank);
            write_ppm(filename, buffer, (int)SCREEN_WIDTH, (int)SCREEN_HEIGHT);
            free(buffer);
        }
    }

    /* Print logging header. */
    {
        timings_type *timing_collection = malloc(num_proc*sizeof(timings_type));
        const char *strategy_name;
        const char *si_strategy_name;
        IceTInt max_image_split;

        strategy_name = icetGetStrategyName();
        if (g_single_image_strategy == ICET_SINGLE_IMAGE_STRATEGY_RADIXK) {
            static char name_buffer[256];
            IceTInt magic_k;

            icetGetIntegerv(ICET_MAGIC_K, &magic_k);
            sprintf(name_buffer, "radix-k %d", (int)magic_k);
            si_strategy_name = name_buffer;
        } else {
            si_strategy_name = icetGetSingleImageStrategyName();
        }

        icetGetIntegerv(ICET_MAX_IMAGE_SPLIT, &max_image_split);

        for (frame = 0; frame < g_num_frames; frame++) {
            timings_type *timing = &timing_array[frame];

            icetCommGather(timing,
                           sizeof(timings_type),
                           ICET_BYTE,
                           timing_collection,
                           0);

            if (rank == 0) {
                int p;
                IceTInt64 total_bytes_sent = 0;

                for (p = 0; p < num_proc; p++) {
#define UPDATE_MAX(field) if (timing->field < timing_collection[p].field) timing->field = timing_collection[p].field;
                    UPDATE_MAX(render_time);
                    UPDATE_MAX(buffer_read_time);
                    UPDATE_MAX(buffer_write_time);
                    UPDATE_MAX(compress_time);
                    UPDATE_MAX(blend_time);
                    UPDATE_MAX(draw_time);
                    UPDATE_MAX(composite_time);
                    UPDATE_MAX(collect_time);
                    UPDATE_MAX(bytes_sent);
                    UPDATE_MAX(frame_time);
                    total_bytes_sent += timing_collection[p].bytes_sent;
                }

                printf("LOG,%d,%s,%s,%d,%d,%d,%d,%s,%s,%s,%d,%d,%lg,%lg,%lg,%lg,%lg,%lg,%lg,%lg,%ld,%lg\n",
                       num_proc,
                       strategy_name,
                       si_strategy_name,
                       g_num_tiles_x,
                       g_num_tiles_y,
                       SCREEN_WIDTH,
                       SCREEN_HEIGHT,
                       g_transparent ? "yes" : "no",
                       g_no_interlace ? "no" : "yes",
                       g_no_collect ? "no" : "yes",
                       max_image_split,
                       frame,
                       timing->render_time,
                       timing->buffer_read_time,
                       timing->buffer_write_time,
                       timing->compress_time,
                       timing->blend_time,
                       timing->draw_time,
                       timing->composite_time,
                       timing->collect_time,
                       (long int)total_bytes_sent,
                       timing->frame_time);
            }
        }

        free(timing_collection);
    }

    free_region_divide(region_divisions);
    free(timing_array);

    /* This is to prevent a non-root from printing while the root is writing
       the log. */
    icetCommBarrier();

    return TEST_PASSED;
}